

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O3

LY_ERR parse_config(lysp_yang_ctx *ctx,uint16_t *flags,lysp_ext_instance **exts)

{
  ulong uVar1;
  ushort uVar2;
  LY_ERR LVar3;
  int iVar4;
  char *format;
  ly_ctx *plVar5;
  char *pcVar6;
  ly_stmt kw;
  char *word;
  size_t word_len;
  char *buf;
  ly_stmt local_4c;
  char *local_48;
  ulong local_40;
  char *local_38;
  
  if ((*flags & 3) == 0) {
    LVar3 = get_argument(ctx,Y_STR_ARG,(uint16_t *)0x0,&local_48,&local_38,&local_40);
    uVar1 = local_40;
    if (LVar3 != LY_SUCCESS) {
      return LVar3;
    }
    if (local_40 == 5) {
      iVar4 = strncmp(local_48,"false",5);
      if (iVar4 == 0) {
        uVar2 = 2;
        goto LAB_00171f6b;
      }
    }
    else if ((local_40 == 4) && (iVar4 = strncmp(local_48,"true",4), iVar4 == 0)) {
      uVar2 = 1;
LAB_00171f6b:
      *flags = *flags | uVar2;
      free(local_38);
      LVar3 = get_keyword(ctx,&local_4c,&local_48,&local_40);
      if (LVar3 != LY_SUCCESS) {
        return LVar3;
      }
      if (local_4c == LY_STMT_SYNTAX_SEMICOLON) {
        return LY_SUCCESS;
      }
      if (local_4c == LY_STMT_SYNTAX_LEFT_BRACE) {
        LVar3 = get_keyword(ctx,&local_4c,&local_48,&local_40);
        if (LVar3 != LY_SUCCESS) {
          return LVar3;
        }
        if (local_4c == LY_STMT_SYNTAX_RIGHT_BRACE) {
          return LY_SUCCESS;
        }
        do {
          if (local_4c != LY_STMT_EXTENSION_INSTANCE) {
            if (ctx == (lysp_yang_ctx *)0x0) {
              plVar5 = (ly_ctx *)0x0;
            }
            else {
              plVar5 = (ly_ctx *)
                       **(undefined8 **)
                         (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
            }
            pcVar6 = lyplg_ext_stmt2str(local_4c);
            ly_vlog(plVar5,(char *)0x0,LYVE_SYNTAX_YANG,
                    "Invalid keyword \"%s\" as a child of \"%s\".",pcVar6,"config");
            return LY_EVALID;
          }
          LVar3 = parse_ext(ctx,local_48,local_40,flags,LY_STMT_CONFIG,0,exts);
          if (LVar3 != LY_SUCCESS) {
            return LVar3;
          }
          LVar3 = get_keyword(ctx,&local_4c,&local_48,&local_40);
          if (LVar3 != LY_SUCCESS) {
            return LVar3;
          }
        } while (local_4c != LY_STMT_SYNTAX_RIGHT_BRACE);
        return LY_SUCCESS;
      }
      if (ctx == (lysp_yang_ctx *)0x0) {
        plVar5 = (ly_ctx *)0x0;
      }
      else {
        plVar5 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      pcVar6 = lyplg_ext_stmt2str(local_4c);
      format = "Invalid keyword \"%s\", expected \";\" or \"{\".";
      goto LAB_00171ea8;
    }
    if (ctx == (lysp_yang_ctx *)0x0) {
      plVar5 = (ly_ctx *)0x0;
    }
    else {
      plVar5 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    ly_vlog(plVar5,(char *)0x0,LYVE_SYNTAX_YANG,"Invalid value \"%.*s\" of \"%s\".",
            uVar1 & 0xffffffff,local_48,"config");
    free(local_38);
  }
  else {
    if (ctx == (lysp_yang_ctx *)0x0) {
      plVar5 = (ly_ctx *)0x0;
    }
    else {
      plVar5 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    format = "Duplicate keyword \"%s\".";
    pcVar6 = "config";
LAB_00171ea8:
    ly_vlog(plVar5,(char *)0x0,LYVE_SYNTAX_YANG,format,pcVar6);
  }
  return LY_EVALID;
}

Assistant:

static LY_ERR
parse_config(struct lysp_yang_ctx *ctx, uint16_t *flags, struct lysp_ext_instance **exts)
{
    LY_ERR ret = LY_SUCCESS;
    char *buf, *word;
    size_t word_len;
    enum ly_stmt kw;

    if (*flags & LYS_CONFIG_MASK) {
        LOGVAL_PARSER(ctx, LY_VCODE_DUPSTMT, "config");
        return LY_EVALID;
    }

    /* get value */
    LY_CHECK_RET(get_argument(ctx, Y_STR_ARG, NULL, &word, &buf, &word_len));

    if ((word_len == ly_strlen_const("true")) && !strncmp(word, "true", word_len)) {
        *flags |= LYS_CONFIG_W;
    } else if ((word_len == ly_strlen_const("false")) && !strncmp(word, "false", word_len)) {
        *flags |= LYS_CONFIG_R;
    } else {
        LOGVAL_PARSER(ctx, LY_VCODE_INVAL, (int)word_len, word, "config");
        free(buf);
        return LY_EVALID;
    }
    free(buf);

    YANG_READ_SUBSTMT_FOR_GOTO(ctx, kw, word, word_len, ret, cleanup) {
        switch (kw) {
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(parse_ext(ctx, word, word_len, flags, LY_STMT_CONFIG, 0, exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(kw), "config");
            return LY_EVALID;
        }
        YANG_READ_SUBSTMT_NEXT_ITER(ctx, kw, word, word_len, NULL, ret, cleanup);
    }

cleanup:
    return ret;
}